

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O2

void av1_quant(MACROBLOCK *x,int plane,int block,TxfmParam *txfm_param,QUANT_PARAM *qparam)

{
  byte tx_size;
  byte bVar1;
  int iVar2;
  tran_low_t *ptVar3;
  uint8_t uVar4;
  int iVar5;
  int iVar6;
  tran_low_t *qcoeff_ptr;
  tran_low_t *dqcoeff_ptr;
  uint16_t *eob_ptr;
  
  tx_size = txfm_param->tx_size;
  bVar1 = txfm_param->tx_type;
  iVar6 = block << 4;
  qcoeff_ptr = x->plane[plane].qcoeff + iVar6;
  eob_ptr = x->plane[plane].eobs + block;
  iVar2 = qparam->xform_quant_idx;
  if ((long)iVar2 != 3) {
    ptVar3 = x->plane[plane].coeff;
    dqcoeff_ptr = x->plane[plane].dqcoeff + iVar6;
    iVar5 = av1_get_max_eob(tx_size);
    if (x->seg_skip_block == 0) {
      (*quant_func_list[iVar2][txfm_param->is_hbd])
                (ptVar3 + iVar6,(long)iVar5,x->plane + plane,qcoeff_ptr,dqcoeff_ptr,eob_ptr,
                 av1_scan_orders[tx_size] + bVar1,qparam);
    }
    else {
      av1_quantize_skip((long)iVar5,qcoeff_ptr,dqcoeff_ptr,eob_ptr);
    }
  }
  if (qparam->use_optimize_b == 0) {
    uVar4 = av1_get_txb_entropy_context(qcoeff_ptr,av1_scan_orders[tx_size] + bVar1,(uint)*eob_ptr);
  }
  else {
    uVar4 = '\0';
  }
  x->plane[plane].txb_entropy_ctx[block] = uVar4;
  return;
}

Assistant:

void av1_quant(MACROBLOCK *x, int plane, int block, TxfmParam *txfm_param,
               const QUANT_PARAM *qparam) {
  const struct macroblock_plane *const p = &x->plane[plane];
  const SCAN_ORDER *const scan_order =
      get_scan(txfm_param->tx_size, txfm_param->tx_type);
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *const coeff = p->coeff + block_offset;
  tran_low_t *const qcoeff = p->qcoeff + block_offset;
  tran_low_t *const dqcoeff = p->dqcoeff + block_offset;
  uint16_t *const eob = &p->eobs[block];

  if (qparam->xform_quant_idx != AV1_XFORM_QUANT_SKIP_QUANT) {
    const int n_coeffs = av1_get_max_eob(txfm_param->tx_size);
    if (LIKELY(!x->seg_skip_block)) {
#if CONFIG_AV1_HIGHBITDEPTH
      quant_func_list[qparam->xform_quant_idx][txfm_param->is_hbd](
          coeff, n_coeffs, p, qcoeff, dqcoeff, eob, scan_order, qparam);
#else
      quant_func_list[qparam->xform_quant_idx](
          coeff, n_coeffs, p, qcoeff, dqcoeff, eob, scan_order, qparam);
#endif
    } else {
      av1_quantize_skip(n_coeffs, qcoeff, dqcoeff, eob);
    }
  }
  // use_optimize_b is true means av1_optimze_b will be called,
  // thus cannot update entropy ctx now (performed in optimize_b)
  if (qparam->use_optimize_b) {
    p->txb_entropy_ctx[block] = 0;
  } else {
    p->txb_entropy_ctx[block] =
        av1_get_txb_entropy_context(qcoeff, scan_order, *eob);
  }
}